

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  Fts5StructureSegment *pFVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  int sz;
  Fts5StructureLevel *pTst;
  int szMax;
  int i;
  int nSeg;
  int szSeg;
  Fts5StructureSegment *pSeg;
  int local_28;
  int szPromote;
  int iPromote;
  int iTst;
  Fts5Structure *pStruct_local;
  int iLvl_local;
  Fts5Index *p_local;
  
  if (p->rc == 0) {
    local_28 = -1;
    pSeg._4_4_ = 0;
    if (pStruct->aLevel[iLvl].nSeg != 0) {
      pFVar1 = pStruct->aLevel[iLvl].aSeg;
      iVar3 = pStruct->aLevel[iLvl].nSeg + -1;
      iVar3 = (pFVar1[iVar3].pgnoLast + 1) - pFVar1[iVar3].pgnoFirst;
      szPromote = iLvl + -1;
      while( true ) {
        bVar5 = false;
        if (-1 < szPromote) {
          bVar5 = pStruct->aLevel[szPromote].nSeg == 0;
        }
        if (!bVar5) break;
        szPromote = szPromote + -1;
      }
      if (-1 < szPromote) {
        pTst._0_4_ = 0;
        lVar4 = (long)szPromote;
        for (pTst._4_4_ = 0; pTst._4_4_ < pStruct->aLevel[lVar4].nSeg; pTst._4_4_ = pTst._4_4_ + 1)
        {
          iVar2 = (pStruct->aLevel[lVar4].aSeg[pTst._4_4_].pgnoLast -
                  pStruct->aLevel[lVar4].aSeg[pTst._4_4_].pgnoFirst) + 1;
          if ((int)pTst < iVar2) {
            pTst._0_4_ = iVar2;
          }
        }
        if (iVar3 <= (int)pTst) {
          local_28 = szPromote;
          pSeg._4_4_ = (int)pTst;
        }
      }
      if (local_28 < 0) {
        pSeg._4_4_ = iVar3;
        local_28 = iLvl;
      }
      fts5StructurePromoteTo(p,local_28,pSeg._4_4_,pStruct);
    }
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level 
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}